

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedStoragesList.hpp
# Opt level: O0

void __thiscall
supermap::
SortedStoragesList<supermap::KeyValue<char,_char>,_char,_void,_char,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>_>
::SortedStoragesList
          (SortedStoragesList<supermap::KeyValue<char,_char>,_char,_void,_char,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>_>
           *this)

{
  Findable<supermap::KeyValue<char,_char>,_char> *in_RDI;
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>,_void>_>_>_()>
  *in_stack_ffffffffffffffc0;
  anon_class_1_0_00000001 local_28 [16];
  InnerRegisterSupplier *in_stack_ffffffffffffffe8;
  OrderedStorage<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>,_char,_void>
  *in_stack_fffffffffffffff0;
  
  Findable<supermap::KeyValue<char,_char>,_char>::Findable(in_RDI);
  std::
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,char>,char,void,char>,void>,std::default_delete<supermap::StorageItemRegister<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,char>,char,void,char>,void>>>()>
  ::
  function<supermap::SortedStoragesList<supermap::KeyValue<char,char>,char,void,char,supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,char>,char,void,char>>::SortedStoragesList()::_lambda()_1_,void>
            (in_stack_ffffffffffffffc0,local_28);
  OrderedStorage<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>,_char,_void>
  ::OrderedStorage(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  std::
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>,_void>_>_>_()>
  ::~function((function<std::unique_ptr<supermap::StorageItemRegister<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>,_void>_>_>_()>
               *)0x190a93);
  in_RDI->_vptr_Findable = (_func_int **)&PTR___cxa_pure_virtual_0038b7f8;
  in_RDI[1]._vptr_Findable = (_func_int **)&PTR___cxa_pure_virtual_0038b820;
  return;
}

Assistant:

SortedStoragesList()
        : OrderedStorage<SortedStorage, IndexT, void>([]() { return std::make_unique<StoragesRegister>(); }) {}